

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O3

wchar_t curses_display_objects
                  (nh_objitem_conflict *items,wchar_t icount,char *title,wchar_t how,
                  nh_objresult_conflict *results)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint uVar3;
  gamewin *gw;
  WINDOW *pWVar4;
  _func_void_gamewin_ptr *p_Var5;
  char *pcVar6;
  nh_menuitem_conflict *items_00;
  ulong uVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  nh_bool *pnVar13;
  int iVar14;
  code *pcVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  _func_void_gamewin_ptr *p_Var20;
  wchar_t *pwVar21;
  byte bVar22;
  ulong uVar23;
  wchar_t ccount;
  long local_208;
  undefined4 local_200;
  wchar_t selected [1];
  nh_cmd_arg local_1c0;
  char sbuf [256];
  char title_1 [128];
  
  local_200 = curs_set(0);
  gw = alloc_gamewin(L'H');
  gw->draw = draw_objmenu;
  gw->resize = resize_objmenu;
  gw[1].resize = (_func_void_gamewin_ptr *)items;
  *(wchar_t *)&gw[1].prev = icount;
  gw[1].next = (gamewin *)title;
  *(wchar_t *)((long)&gw[1].prev + 4) = how;
  *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
  pWVar4 = (WINDOW *)calloc((long)icount,4);
  gw[1].win = pWVar4;
  uVar23 = (ulong)(uint)icount;
  if (L'\0' < icount && (uint)(how + L'\xffffffff') < 0xfffffffe) {
    cVar9 = 'a';
    lVar8 = 0;
    do {
      if ((((&items->accel)[lVar8] == '\0') && (*(int *)((long)&items->role + lVar8) == 1)) &&
         (*(int *)((long)&items->id + lVar8) != 0)) {
        (&items->accel)[lVar8] = cVar9;
        if (cVar9 == 'z') {
          cVar9 = 'A';
        }
        else if (cVar9 == 'Z') {
          cVar9 = 'a';
        }
        else {
          cVar9 = cVar9 + '\x01';
        }
      }
      lVar8 = lVar8 + 0x124;
    } while (uVar23 * 0x124 - lVar8 != 0);
  }
  layout_objmenu(gw);
  iVar18 = *(int *)((long)&gw[2].win + 4);
  pWVar4 = (WINDOW *)
           newwin(*(int *)&gw[2].resize,iVar18,(_LINES - *(int *)&gw[2].resize) / 2,
                  (_COLS - iVar18) / 2);
  gw->win = pWVar4;
  keypad(pWVar4,1);
  nh_box_wborder((WINDOW_conflict *)gw->win,0x600);
  p_Var5 = (_func_void_gamewin_ptr *)
           derwin(gw->win,*(undefined4 *)&gw[2].win,*(undefined4 *)&gw[2].next,
                  *(int *)((long)&gw[2].resize + 4) + -1,2);
  gw[1].draw = p_Var5;
  leaveok(gw->win,1);
  leaveok(gw[1].draw);
LAB_0010d80c:
  draw_objmenu(gw);
  wVar2 = nh_wgetch(gw->win);
  bVar22 = 0;
  iVar18 = 0;
  if (wVar2 < L'|') {
    if (wVar2 < L':') {
      if (wVar2 < L',') {
        if (wVar2 == L' ') goto switchD_0010d848_caseD_3e;
        if (wVar2 != L'\r') {
          if (wVar2 != L'\x1b') goto switchD_0010d848_caseD_3b;
          bVar22 = 1;
        }
        goto LAB_0010dfaf;
      }
      if (wVar2 == L',') {
        if (*(int *)((long)&gw[1].prev + 4) == 2) {
          wVar2 = *(wchar_t *)&gw[2].draw;
          lVar8 = (long)wVar2;
          if (wVar2 < icount) {
            lVar19 = lVar8 * 0x49 + 0x44;
            iVar18 = icount - wVar2;
            do {
              if ((long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw <= lVar8) break;
              if (*(int *)(gw[1].resize + lVar19 * 4) != -1) {
                ((gw[1].win)->_bkgrnd).chars[lVar8 + -0x17] = L'\xffffffff';
              }
              lVar8 = lVar8 + 1;
              lVar19 = lVar19 + 0x49;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
        }
        goto LAB_0010d80c;
      }
      if (wVar2 == L'-') {
        if (L'\0' < icount) {
          memset(gw[1].win,0,uVar23 * 4);
        }
        goto LAB_0010d80c;
      }
      if (wVar2 == L'.') {
        if (*(int *)((long)&gw[1].prev + 4) == 2 && L'\0' < icount) {
          pcVar15 = gw[1].resize + 0x110;
          uVar7 = 0;
          do {
            if (*(int *)pcVar15 != -1) {
              ((gw[1].win)->_bkgrnd).chars[uVar7 - 0x17] = L'\xffffffff';
            }
            uVar7 = uVar7 + 1;
            pcVar15 = pcVar15 + 0x124;
          } while (uVar23 != uVar7);
        }
        goto LAB_0010d80c;
      }
    }
    else {
      switch(wVar2) {
      case L':':
        curses_getline("Search:",sbuf);
        if (L'\0' < icount) {
          p_Var5 = gw[1].resize;
          uVar7 = 0;
          do {
            pcVar6 = strstr((char *)p_Var5,sbuf);
            if (pcVar6 != (char *)0x0) {
              iVar10 = *(int *)&gw[1].prev - *(int *)&gw[2].win;
              if (iVar10 < 1) {
                iVar10 = iVar18;
              }
              if ((int)uVar7 < iVar10) {
                iVar10 = (int)uVar7;
              }
              *(int *)&gw[2].draw = iVar10;
              break;
            }
            uVar7 = uVar7 + 1;
            p_Var5 = p_Var5 + 0x124;
          } while (uVar23 != uVar7);
        }
        goto LAB_0010d80c;
      case L';':
      case L'=':
      case L'?':
        break;
      case L'<':
switchD_0010d848_caseD_3c:
        iVar10 = *(int *)&gw[2].draw;
LAB_0010da38:
        iVar10 = iVar10 - *(int *)&gw[2].win;
        if (iVar10 < 1) {
          iVar10 = iVar18;
        }
        *(int *)&gw[2].draw = iVar10;
        goto LAB_0010d80c;
      case L'>':
        goto switchD_0010d848_caseD_3e;
      case L'@':
        if (*(int *)((long)&gw[1].prev + 4) == 2 && L'\0' < icount) {
          pcVar15 = gw[1].resize + 0x110;
          uVar7 = 0;
          do {
            if (*(int *)pcVar15 != -1) {
              ((gw[1].win)->_bkgrnd).chars[uVar7 - 0x17] =
                   -(uint)(((gw[1].win)->_bkgrnd).chars[uVar7 - 0x17] == L'\0');
            }
            uVar7 = uVar7 + 1;
            pcVar15 = pcVar15 + 0x124;
          } while (uVar23 != uVar7);
        }
        goto LAB_0010d80c;
      default:
        if (wVar2 == L'\\') {
          wVar2 = *(wchar_t *)&gw[2].draw;
          lVar8 = (long)wVar2;
          if (wVar2 < icount) {
            lVar19 = lVar8 * 0x49 + 0x44;
            iVar18 = icount - wVar2;
            do {
              if ((long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw <= lVar8) break;
              if (*(int *)(gw[1].resize + lVar19 * 4) != -1) {
                ((gw[1].win)->_bkgrnd).chars[lVar8 + -0x17] = L'\0';
              }
              lVar8 = lVar8 + 1;
              lVar19 = lVar19 + 0x49;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          goto LAB_0010d80c;
        }
        if (wVar2 == L'^') goto switchD_0010d8c1_caseD_106;
      }
    }
  }
  else if (wVar2 < L'Œ') {
    if (L'ā' < wVar2) {
      switch(wVar2) {
      case L'Ă':
        if (*(int *)&gw[2].draw < *(int *)&gw[1].prev - *(int *)&gw[2].win) {
          *(int *)&gw[2].draw = *(int *)&gw[2].draw + 1;
        }
        break;
      case L'ă':
        if (0 < *(int *)&gw[2].draw) {
          *(int *)&gw[2].draw = *(int *)&gw[2].draw + -1;
        }
        break;
      default:
        goto switchD_0010d848_caseD_3b;
      case L'Ć':
switchD_0010d8c1_caseD_106:
        *(undefined4 *)&gw[2].draw = 0;
        break;
      case L'ć':
switchD_0010d8c1_caseD_107:
        iVar18 = *(int *)((long)&gw[2].draw + 4);
        iVar10 = iVar18 / 10;
        if (iVar18 + 9U < 0x13) {
          iVar10 = -1;
        }
        *(int *)((long)&gw[2].draw + 4) = iVar10;
      }
      goto LAB_0010d80c;
    }
    if (wVar2 == L'|') {
LAB_0010da34:
      iVar10 = *(int *)&gw[1].prev;
      goto LAB_0010da38;
    }
    if (wVar2 == L'~') {
      if (*(int *)((long)&gw[1].prev + 4) == 2) {
        wVar2 = *(wchar_t *)&gw[2].draw;
        lVar8 = (long)wVar2;
        if (wVar2 < icount) {
          lVar19 = lVar8 * 0x49 + 0x44;
          iVar18 = icount - wVar2;
          do {
            if ((long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw <= lVar8) break;
            if (*(int *)(gw[1].resize + lVar19 * 4) != -1) {
              ((gw[1].win)->_bkgrnd).chars[lVar8 + -0x17] =
                   -(uint)(((gw[1].win)->_bkgrnd).chars[lVar8 + -0x17] == L'\0');
            }
            lVar8 = lVar8 + 1;
            lVar19 = lVar19 + 0x49;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
      }
      goto LAB_0010d80c;
    }
    if (wVar2 == L'\x7f') goto switchD_0010d8c1_caseD_107;
  }
  else if (wVar2 < L'ŗ') {
    if (wVar2 == L'Œ') goto switchD_0010d848_caseD_3e;
    if (wVar2 == L'œ') goto switchD_0010d848_caseD_3c;
  }
  else {
    if (wVar2 == L'Ũ') goto LAB_0010da34;
    if (wVar2 == L'ŗ') goto LAB_0010dfaf;
  }
switchD_0010d848_caseD_3b:
  if (9 < (uint)(wVar2 + L'\xffffffd0')) {
    uVar3 = *(uint *)&gw[1].prev;
    uVar7 = (ulong)uVar3;
    iVar18 = *(int *)&gw[2].draw;
    uVar11 = (ulong)iVar18;
    uVar17 = *(int *)&gw[2].win + iVar18;
    if ((int)uVar3 < (int)uVar17) {
      uVar17 = uVar3;
    }
    if (iVar18 < (int)uVar17) {
      p_Var5 = gw[1].resize;
      iVar18 = uVar17 - iVar18;
      p_Var20 = p_Var5 + uVar11 * 0x124 + 0x120;
      do {
        if (wVar2 == (char)*p_Var20) goto LAB_0010dcdb;
        uVar11 = uVar11 + 1;
        p_Var20 = p_Var20 + 0x124;
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
    if (0 < (int)uVar3 && *(int *)&gw[2].win < (int)uVar3) {
      p_Var5 = gw[1].resize;
      pcVar15 = p_Var5 + 0x120;
      uVar11 = 0;
      do {
        if (wVar2 == (char)*pcVar15) goto LAB_0010dcdb;
        uVar11 = uVar11 + 1;
        pcVar15 = pcVar15 + 0x124;
      } while (uVar7 != uVar11);
    }
    goto LAB_0010dce4;
  }
  iVar10 = *(int *)((long)&gw[2].draw + 4);
  iVar14 = iVar10 * 10;
  if (iVar10 == -1) {
    iVar14 = iVar18;
  }
  uVar3 = iVar14 + wVar2 + L'\xffffffd0';
  *(uint *)((long)&gw[2].draw + 4) = uVar3;
  if (0xffff < (int)uVar3) {
    *(uint *)((long)&gw[2].draw + 4) = uVar3 / 10;
  }
  goto LAB_0010d80c;
switchD_0010d848_caseD_3e:
  iVar18 = *(int *)&gw[2].draw;
  iVar14 = *(int *)&gw[1].prev - *(int *)&gw[2].win;
  iVar10 = *(int *)&gw[2].win + iVar18;
  if (iVar14 <= iVar10) {
    iVar10 = iVar14;
  }
  *(int *)&gw[2].draw = iVar10;
  if ((wVar2 == L' ') && (iVar18 == iVar10)) {
LAB_0010dfac:
    bVar22 = 0;
LAB_0010dfaf:
    delwin(gw[1].draw);
    delwin(gw->win);
    pWVar4 = gw[1].win;
    if (icount < L'\x01' || bVar22 != 0) {
      wVar2 = -(uint)bVar22;
    }
    else {
      pwVar21 = &items->id;
      uVar7 = 0;
      wVar2 = L'\0';
      do {
        if ((pWVar4->_bkgrnd).chars[uVar7 - 0x17] != L'\0') {
          if (results != (nh_objresult_conflict *)0x0) {
            results[wVar2].id = *pwVar21;
            results[wVar2].count = (pWVar4->_bkgrnd).chars[uVar7 - 0x17];
          }
          wVar2 = wVar2 + L'\x01';
        }
        uVar7 = uVar7 + 1;
        pwVar21 = pwVar21 + 0x49;
      } while (uVar23 != uVar7);
    }
    free(pWVar4);
    delete_gamewin(gw);
    redraw_game_windows();
    curs_set(local_200);
    return wVar2;
  }
  goto LAB_0010d80c;
LAB_0010dcdb:
  if ((int)uVar11 == -1) {
LAB_0010dce4:
    if (0 < (int)uVar3 && *(int *)((long)&gw[1].prev + 4) == 2) {
      lVar8 = 0;
      lVar19 = 0;
      iVar18 = 0;
      do {
        if ((wVar2 == (&items->group_accel)[lVar8]) &&
           (p_Var5 = gw[1].resize, *(int *)(p_Var5 + lVar8 + 0x110) != -1)) {
          wVar1 = *(wchar_t *)((long)&gw[2].draw + 4);
          pWVar4 = gw[1].win;
          if (wVar1 < L'\x01') {
            wVar1 = -(uint)((pWVar4->_bkgrnd).chars[lVar19 + -0x17] == L'\0');
          }
          (pWVar4->_bkgrnd).chars[lVar19 + -0x17] = wVar1;
          if (*(wchar_t *)(p_Var5 + lVar8 + 0x108) <= wVar1) {
            (pWVar4->_bkgrnd).chars[lVar19 + -0x17] = L'\xffffffff';
          }
          iVar18 = iVar18 + 1;
          uVar7 = (ulong)*(uint *)&gw[1].prev;
        }
        lVar19 = lVar19 + 1;
        lVar8 = lVar8 + 0x124;
      } while (lVar19 < (int)uVar7);
      if (iVar18 != 0) {
        *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
      }
    }
  }
  else {
    iVar18 = *(int *)((long)&gw[2].draw + 4);
    lVar8 = (long)(uVar11 << 0x20) >> 0x1e;
    pWVar4 = gw[1].win;
    if (iVar18 < 1) {
      iVar18 = -(uint)(*(int *)((long)(pWVar4->_bkgrnd).chars + lVar8 + -0x5c) == 0);
    }
    *(int *)((long)(pWVar4->_bkgrnd).chars + lVar8 + -0x5c) = iVar18;
    lVar19 = (long)(uVar11 << 0x20) >> 0x20;
    lVar16 = lVar19 * 0x124;
    if (*(int *)(p_Var5 + lVar16 + 0x108) <= *(int *)((long)(pWVar4->_bkgrnd).chars + lVar8 + -0x5c)
       ) {
      (pWVar4->_bkgrnd).chars[lVar19 + -0x17] = L'\xffffffff';
    }
    *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
    iVar18 = *(int *)((long)&gw[1].prev + 4);
    if (iVar18 == -1) {
      ccount = L'\0';
      lVar8 = nh_get_object_commands(&ccount);
      wVar2 = ccount;
      if (ccount != L'\0' && lVar8 != 0) {
        lVar19 = (long)ccount;
        local_208 = lVar8;
        items_00 = (nh_menuitem_conflict *)malloc(lVar19 * 0x10c);
        if (L'\0' < wVar2) {
          lVar8 = local_208 + 0x14;
          pnVar13 = &items_00->selected;
          wVar2 = L'\x01';
          lVar12 = 0;
          do {
            ((nh_menuitem_conflict *)(pnVar13 + -0x10a))->id = wVar2;
            *(nh_menuitem_role *)(pnVar13 + -0x106) = MI_NORMAL;
            pnVar13[-2] = *(char *)(local_208 + 100 + lVar12);
            *(undefined2 *)(pnVar13 + -1) = 0;
            strcpy(pnVar13 + -0x102,(char *)(lVar8 + lVar12));
            lVar12 = lVar12 + 0x6c;
            wVar2 = wVar2 + L'\x01';
            pnVar13 = pnVar13 + 0x10c;
          } while (lVar19 * 0x6c != lVar12);
        }
        if ((settings.invweight == '\0') || (*(int *)(p_Var5 + lVar16 + 0x118) == -1)) {
          snprintf(title_1,0x80,"%c - %s",(ulong)(uint)(int)(char)p_Var5[lVar16 + 0x120]);
        }
        else {
          snprintf(title_1,0x80,"%c - %s {%d}",(ulong)(uint)(int)(char)p_Var5[lVar16 + 0x120]);
        }
        wVar2 = curses_display_menu_core
                          (items_00,ccount,title_1,L'\x01',selected,L'\0',L'\0',L'\xffffffff',
                           L'\xffffffff',(_func_nh_bool_win_menu_ptr_wchar_t *)0x0,'\0');
        free(items_00);
        if (L'\0' < wVar2) {
          cVar9 = *(char *)(local_208 + -7 + (long)selected[0] * 0x6c);
          if (cVar9 == '\0') {
            local_1c0.argtype = 2;
          }
          else {
            local_1c0.argtype = 0x10;
            local_1c0.field_1.invlet = cVar9;
          }
          set_next_command((char *)(local_208 + (long)selected[0] * 0x6c + -0x6c),&local_1c0);
          goto LAB_0010dfac;
        }
      }
    }
    else if (iVar18 == 1) goto LAB_0010dfac;
  }
  goto LAB_0010d80c;
}

Assistant:

int curses_display_objects(struct nh_objitem *items, int icount,
		  const char *title, int how, struct nh_objresult *results)
{
    struct gamewin *gw;
    struct win_objmenu *mdat;
    int i, key, idx, rv, startx, starty, prevcurs, prev_offset;
    nh_bool done, cancelled;
    char sbuf[BUFSZ];
    
    prevcurs = curs_set(0);
    
    gw = alloc_gamewin(sizeof(struct win_objmenu));
    gw->draw = draw_objmenu;
    gw->resize = resize_objmenu;
    mdat = (struct win_objmenu*)gw->extra;
    mdat->items = items;
    mdat->icount = icount;
    mdat->title = title;
    mdat->how = how;
    mdat->selcount = -1;
    mdat->selected = calloc(icount, sizeof(int));
    
    if (how != PICK_NONE && how != PICK_INVACTION)
	assign_objmenu_accelerators(mdat);
    layout_objmenu(gw);
    
    starty = (LINES - mdat->height) / 2;
    startx = (COLS - mdat->width) / 2;
    
    gw->win = newwin(mdat->height, mdat->width, starty, startx);
    keypad(gw->win, TRUE);
    nh_box_wborder(gw->win, FRAME_ATTRS);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    leaveok(gw->win, TRUE);
    leaveok(mdat->content, TRUE);
    
    done = FALSE;
    cancelled = FALSE;
    while (!done && !cancelled) {
	draw_objmenu(gw);
	
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    /* one line up */
	    case KEY_UP:
		if (mdat->offset > 0)
		    mdat->offset--;
		break;
		
	    /* one line down */
	    case KEY_DOWN:
		if (mdat->offset < mdat->icount - mdat->innerheight)
		    mdat->offset++;
		break;
	    
	    /* page up */
	    case KEY_PPAGE:
	    case '<':
		mdat->offset -= mdat->innerheight;
		if (mdat->offset < 0)
		    mdat->offset = 0;
		break;
	    
	    /* page down */
	    case KEY_NPAGE:
	    case '>':
	    case ' ':
		prev_offset = mdat->offset;
		mdat->offset += mdat->innerheight;
		if (mdat->offset > mdat->icount - mdat->innerheight)
		    mdat->offset = mdat->icount - mdat->innerheight;
		if (key == ' ' && prev_offset == mdat->offset)
		    done = TRUE;
		break;
		
	    /* go to the top */
	    case KEY_HOME:
	    case '^':
		mdat->offset = 0;
		break;
		
	    /* go to the end */
	    case KEY_END:
	    case '|':
		mdat->offset = max(mdat->icount - mdat->innerheight, 0);
		break;
		
	    /* cancel */
	    case KEY_ESC:
		cancelled = TRUE;
		break;
		
	    /* confirm */
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;
		
	    /* select all */
	    case '.':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].oclass != -1)
			    mdat->selected[i] = -1;
		break;
		
	    /* select none */
	    case '-':
		for (i = 0; i < icount; i++)
		    mdat->selected[i] = 0;
		break;
		
	    /* invert all */
	    case '@':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].oclass != -1)
			    mdat->selected[i] = mdat->selected[i] ? 0 : -1;
		break;
		
	    /* select page */
	    case ',':
		if (mdat->how != PICK_ANY)
		    break;
		
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = -1;
		break;
		
	    /* deselect page */
	    case '\\':
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = 0;
		break;
		
	    /* invert page */
	    case '~':
		if (mdat->how != PICK_ANY)
		    break;
		
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = mdat->selected[i] ? 0 : -1;
		break;
		
	    /* search for a menu item */
	    case ':':
		curses_getline("Search:", sbuf);
		for (i = 0; i < icount; i++)
		    if (strstr(mdat->items[i].caption, sbuf))
			break;
		if (i < icount) {
		    int end = max(mdat->icount - mdat->innerheight, 0);
		    mdat->offset = min(i, end);
		}
		break;
		
	    /* edit selection count */
	    case KEY_BACKSPACE:
	    case KEY_BACKDEL:
		mdat->selcount /= 10;
		if (mdat->selcount == 0)
		    mdat->selcount = -1; /* -1: select all */
		break;
		
	    default:
		/* selection allows an item count */
		if (key >= '0' && key <= '9') {
		    if (mdat->selcount == -1)
			mdat->selcount = 0;
		    mdat->selcount = mdat->selcount * 10 + (key - '0');
		    if (mdat->selcount > 0xffff)
			mdat->selcount /= 10;
		    
		    break;
		}
		
		/* try to find an item for this key and, if one is found, select it */
		idx = find_objaccel(key, mdat);
		
		if (idx != -1) { /* valid item accelerator */
		    if (mdat->selcount > 0)
			mdat->selected[idx] = mdat->selcount;
		    else
			mdat->selected[idx] = mdat->selected[idx] ? 0 : -1;
		    if (mdat->selected[idx] >= mdat->items[idx].count)
			mdat->selected[idx] = -1;
		    mdat->selcount = -1;
		    
		    if (mdat->how == PICK_ONE)
			done = TRUE;
		    
		    /* show item actions menu */
		    else if (mdat->how == PICK_INVACTION)
			if (do_item_actions(&mdat->items[idx]))
			    done = TRUE;
		    
		} else if (mdat->how == PICK_ANY) { /* maybe it's a group accel? */
		    int grouphits = 0;
		    for (i = 0; i < mdat->icount; i++) {
			if (items[i].group_accel == key && mdat->items[i].oclass != -1) {
			    if (mdat->selcount > 0)
				mdat->selected[i] = mdat->selcount;
			    else
				mdat->selected[i] = mdat->selected[i] ? 0 : -1;
			    if (mdat->selected[i] >= mdat->items[i].count)
				mdat->selected[i] = -1;
			    grouphits++;
			}
		    }
		    
		    if (grouphits)
			mdat->selcount = -1;
		}
		break;
	}
    }
    
    delwin(mdat->content);
    delwin(gw->win);
    
    if (cancelled)
	rv = -1;
    else {
	rv = 0;
	for (i = 0; i < icount; i++) {
	    if (mdat->selected[i]) {
		if (results) {
		    results[rv].id = items[i].id;
		    results[rv].count = mdat->selected[i];
		}
		rv++;
	    }
	}
    }
    
    free(mdat->selected);
    delete_gamewin(gw);
    redraw_game_windows();
    curs_set(prevcurs);
	
    return rv;
}